

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::CleanFramebuffers
          (StorageMultisampleTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  StorageMultisampleTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_ms != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_ms);
    this->m_fbo_ms = 0;
  }
  if (this->m_to_ms != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_ms);
    this->m_to_ms = 0;
  }
  if (this->m_fbo_aux != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_aux);
    this->m_fbo_aux = 0;
  }
  if (this->m_to_aux != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_aux);
    this->m_to_aux = 0;
  }
  return;
}

Assistant:

void StorageMultisampleTest::CleanFramebuffers()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Mulitsample framebuffer. */
	if (m_fbo_ms)
	{
		gl.deleteFramebuffers(1, &m_fbo_ms);

		m_fbo_ms = 0;
	}

	/* Mulitsample texture. */
	if (m_to_ms)
	{
		gl.deleteTextures(1, &m_to_ms);

		m_to_ms = 0;
	}

	/* Auxiliary framebuffer. */
	if (m_fbo_aux)
	{
		gl.deleteFramebuffers(1, &m_fbo_aux);

		m_fbo_aux = 0;
	}

	/* Auxiliary texture. */
	if (m_to_aux)
	{
		gl.deleteTextures(1, &m_to_aux);

		m_to_aux = 0;
	}
}